

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

float memory_tree_ns::normalized_linear_prod(memory_tree *b,example *ec1,example *ec2)

{
  flat_example *pfVar1;
  flat_example *pfVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float linear_prod;
  float norm_sqrt;
  flat_example *fec2;
  flat_example *fec1;
  flat_example *in_stack_00000038;
  example *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pfVar1 = flatten_sort_example
                     ((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
  pfVar2 = flatten_sort_example
                     ((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
  dVar5 = std::pow((double)(ulong)(uint)(pfVar1->total_sum_feat_sq * pfVar2->total_sum_feat_sq),
                   5.2220990168286e-315);
  fVar3 = SUB84(dVar5,0);
  fVar4 = linear_kernel(in_stack_00000038,(flat_example *)b);
  free_flatten_example((flat_example *)0x346017);
  free_flatten_example((flat_example *)0x346021);
  return fVar4 / fVar3;
}

Assistant:

float normalized_linear_prod(memory_tree& b, example* ec1, example* ec2)
    {
        flat_example* fec1 = flatten_sort_example(*b.all, ec1);
        flat_example* fec2 = flatten_sort_example(*b.all, ec2);
        float norm_sqrt = pow(fec1->total_sum_feat_sq*fec2->total_sum_feat_sq, 0.5f);
        float linear_prod = linear_kernel(fec1, fec2);
        //fec1->fs.delete_v(); 
        //fec2->fs.delete_v();
        free_flatten_example(fec1);
        free_flatten_example(fec2);
        return linear_prod/norm_sqrt;
    }